

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O1

NondegeneracyCheckResult * __thiscall
slang::ast::SequenceRepetition::checkNondegeneracy(SequenceRepetition *this)

{
  underlying_type uVar1;
  NondegeneracyCheckResult *in_RDI;
  
  uVar1 = 0;
  if ((this->range).min == 0) {
    uVar1 = (uint)(byte)((this->range).max.super__Optional_base<unsigned_int,_true,_true>._M_payload
                         .super__Optional_payload_base<unsigned_int>._M_payload._M_value == 0 &
                        (this->range).max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                        super__Optional_payload_base<unsigned_int>._M_engaged) * 2 + 1;
  }
  (in_RDI->status).m_bits = uVar1;
  (in_RDI->noMatchRange).startLoc = (SourceLocation)0x0;
  (in_RDI->noMatchRange).endLoc = (SourceLocation)0x0;
  in_RDI->isAlwaysFalse = false;
  return in_RDI;
}

Assistant:

AssertionExpr::NondegeneracyCheckResult SequenceRepetition::checkNondegeneracy() const {
    bitmask<NondegeneracyStatus> res;
    if (range.min == 0u) {
        res = NondegeneracyStatus::AdmitsEmpty;
        if (range.max == 0u)
            res |= NondegeneracyStatus::AcceptsOnlyEmpty;
    }
    return {res, {}, false};
}